

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O2

void pzshape::TPZShapeQuad::TransformDerivative2dQ(int transid,int num,TPZFMatrix<double> *in)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  ulong col;
  
  lVar6 = (long)transid * 0x20;
  col = 0;
  uVar7 = (ulong)(uint)num;
  if (num < 1) {
    uVar7 = col;
  }
  for (; uVar7 != col; col = col + 1) {
    pdVar5 = TPZFMatrix<double>::operator()(in,0,col);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(in,1,col);
    dVar2 = *pdVar5;
    dVar3 = *(double *)(gTrans2dQ + lVar6 + 0x10);
    dVar4 = *(double *)(gTrans2dQ + lVar6);
    pdVar5 = TPZFMatrix<double>::operator()(in,0,col);
    *pdVar5 = dVar4 * dVar1 + dVar3 * dVar2;
    dVar3 = *(double *)(gTrans2dQ + lVar6 + 0x18);
    dVar4 = *(double *)(gTrans2dQ + lVar6 + 8);
    pdVar5 = TPZFMatrix<double>::operator()(in,1,col);
    *pdVar5 = dVar1 * dVar4 + dVar2 * dVar3;
  }
  return;
}

Assistant:

void TPZShapeQuad::TransformDerivative2dQ(int transid, int num, TPZFMatrix<REAL> &in) {
		
		for(int i=0;i<num;i++) {
			REAL aux[2];
			aux[0] = in(0,i);
			aux[1] = in(1,i);
			in(0,i) = gTrans2dQ[transid][0][0]*aux[0]+gTrans2dQ[transid][1][0]*aux[1];
			in(1,i) = gTrans2dQ[transid][0][1]*aux[0]+gTrans2dQ[transid][1][1]*aux[1];
		}
	}